

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

int cmsys::regtry(char *string,char **start,char **end,char *prog)

{
  int iVar1;
  long lVar2;
  
  reginput = string;
  regstartp = start;
  regendp = end;
  for (lVar2 = 0; (int)lVar2 != 10; lVar2 = lVar2 + 1) {
    start[lVar2] = (char *)0x0;
    end[lVar2] = (char *)0x0;
  }
  iVar1 = regmatch(prog + 1);
  if (iVar1 != 0) {
    *start = string;
    *end = reginput;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

static int regtry (const char* string, const char* *start,
                   const char* *end, const char* prog) {
                   int    i;
                   const char* *sp1;
                   const char* *ep;

    reginput = string;
    regstartp = start;
    regendp = end;

    sp1 = start;
    ep = end;
    for (i = RegularExpression::NSUBEXP; i > 0; i--) {
        *sp1++ = 0;
        *ep++ = 0;
    }
    if (regmatch(prog + 1)) {
        start[0] = string;
        end[0] = reginput;
        return (1);
    }
    else
        return (0);
}